

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::CodeGenerateException::CodeGenerateException<char_const(&)[37]>
          (CodeGenerateException *this,char *module,int line,char (*args) [37])

{
  char (*in_stack_00000178) [37];
  char *in_stack_00000180;
  int *in_stack_00000188;
  char *in_stack_00000190;
  char **in_stack_00000198;
  Exception *in_stack_000001a0;
  
  Exception::Exception((Exception *)0x1b3906);
  Exception::SetWhat<char_const*&,char,int&,char,char_const(&)[37]>
            (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188,
             in_stack_00000180,in_stack_00000178);
  return;
}

Assistant:

CodeGenerateException(const char *module, int line, Args&&... args)
        {
            SetWhat(module, ':', line, ' ', std::forward<Args>(args)...);
        }